

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O3

bool __thiscall AmsConnection::ReceiveNotification(AmsConnection *this,AoEHeader *header)

{
  RingBuffer *this_00;
  uint8_t *puVar1;
  ostream *poVar2;
  ssize_t sVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *n;
  uint8_t *puVar9;
  uint uVar10;
  SharedDispatcher dispatcher;
  stringstream stream;
  string local_1e8;
  undefined1 local_1c8 [16];
  uint16_t local_1b8;
  char local_1b6 [14];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1b8 = header->leTargetPort;
  local_1b6._0_8_ = *(undefined8 *)&header->sourceNetId;
  DispatcherListGet((AmsConnection *)local_1c8,(VirtualConnection *)this);
  if ((NotificationDispatcher *)local_1c8._0_8_ == (NotificationDispatcher *)0x0) {
    ReceiveJunk(this,(ulong)header->leLength);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"No dispatcher found for notification",0x24);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1e8);
  }
  else {
    this_00 = (RingBuffer *)(local_1c8._0_8_ + 0x20);
    uVar10 = header->leLength;
    n = (uint8_t *)(ulong)uVar10;
    puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
    puVar7 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->read;
    if (puVar9 < puVar7) {
      uVar4 = ~(ulong)puVar9;
    }
    else {
      uVar4 = this_00->dataSize + ~(ulong)puVar9;
    }
    if (n + 4 <= puVar7 + uVar4) {
      lVar6 = 0;
      do {
        *((RingBuffer *)(local_1c8._0_8_ + 0x20))->write = (uint8_t)(uVar10 >> ((byte)lVar6 & 0x1f))
        ;
        RingBuffer::Write(this_00,1);
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x20);
      puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
      puVar7 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->read;
      if (puVar9 < puVar7) {
        puVar7 = puVar7 + ~(ulong)puVar9;
      }
      else {
        puVar8 = (((RingBuffer *)(local_1c8._0_8_ + 0x20))->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        puVar7 = puVar8 + ((RingBuffer *)(local_1c8._0_8_ + 0x20))->dataSize +
                 -(long)(puVar9 + (puVar8 == puVar7));
      }
      if (puVar7 < n) {
        puVar8 = puVar7;
        do {
          for (; puVar7 != (uint8_t *)0x0; puVar7 = puVar7 + -sVar3) {
            sVar3 = Socket::read(&(this->socket).super_Socket,(int)puVar9,puVar7,0);
            puVar9 = puVar9 + sVar3;
          }
          RingBuffer::Write(this_00,(size_t)puVar8);
          puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
          puVar7 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->read;
          if (puVar9 < puVar7) {
            puVar7 = puVar7 + ~(ulong)puVar9;
          }
          else {
            puVar1 = (((RingBuffer *)(local_1c8._0_8_ + 0x20))->data)._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
            puVar7 = puVar1 + ((RingBuffer *)(local_1c8._0_8_ + 0x20))->dataSize +
                     -(long)(puVar9 + (puVar1 == puVar7));
          }
          uVar10 = (int)n - (int)puVar8;
          n = (uint8_t *)(ulong)uVar10;
          puVar8 = puVar7;
        } while (puVar7 < n);
      }
      if (uVar10 != 0) {
        puVar7 = n;
        do {
          sVar3 = Socket::read(&(this->socket).super_Socket,(int)puVar9,puVar7,0);
          puVar9 = puVar9 + sVar3;
          puVar7 = puVar7 + -sVar3;
        } while (puVar7 != (uint8_t *)0x0);
      }
      RingBuffer::Write(this_00,(size_t)n);
      bVar5 = true;
      NotificationDispatcher::Notify((NotificationDispatcher *)local_1c8._0_8_);
      goto LAB_00129b53;
    }
    ReceiveJunk(this,(size_t)n);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"port ",5);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," receive buffer was full",0x18);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  bVar5 = false;
LAB_00129b53:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  return bVar5;
}

Assistant:

bool AmsConnection::ReceiveNotification(const AoEHeader& header)
{
    const auto dispatcher = DispatcherListGet(VirtualConnection { header.targetPort(), header.sourceAms() });
    if (!dispatcher) {
        ReceiveJunk(header.length());
        LOG_WARN("No dispatcher found for notification");
        return false;
    }

    auto& ring = dispatcher->ring;
    auto bytesLeft = header.length();
    if (bytesLeft + sizeof(bytesLeft) > ring.BytesFree()) {
        ReceiveJunk(bytesLeft);
        LOG_WARN("port " << std::dec << header.targetPort() << " receive buffer was full");
        return false;
    }

    /** store AoEHeader.length() in ring buffer to support notification parsing */
    for (size_t i = 0; i < sizeof(bytesLeft); ++i) {
        *ring.write = (bytesLeft >> (8 * i)) & 0xFF;
        ring.Write(1);
    }

    auto chunk = ring.WriteChunk();
    while (bytesLeft > chunk) {
        Receive(ring.write, chunk);
        ring.Write(chunk);
        // We already checked bytesLeft > chunk, well it was not obvious enough for MSVC
        bytesLeft -= static_cast<decltype(bytesLeft)>(chunk);
        chunk = ring.WriteChunk();
    }
    Receive(ring.write, bytesLeft);
    ring.Write(bytesLeft);
    dispatcher->Notify();
    return true;
}